

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::ObjectWrapper<Diligent::FenceVkImpl,_Diligent::IMemoryAllocator>::
DestroyObject(ObjectWrapper<Diligent::FenceVkImpl,_Diligent::IMemoryAllocator> *this)

{
  FenceVkImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::FenceVkImpl,_Diligent::IMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (IMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (FenceVkImpl *)0x0) {
      FenceVkImpl::~FenceVkImpl(this_00);
      RefCountedObject<Diligent::IFenceVk>::operator_delete
                ((RefCountedObject<Diligent::IFenceVk> *)this_00,in_RSI);
    }
  }
  else {
    FenceVkImpl::~FenceVkImpl(this->m_pObject);
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }